

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint32_t __thiscall fmp4_stream::init_fragment::get_time_scale(init_fragment *this)

{
  uchar *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *this_00;
  bool bVar5;
  allocator local_b1;
  undefined1 local_b0 [6];
  uint8_t version;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  uint local_2c;
  uint32_t local_28;
  uint32_t pos;
  uint32_t timescale;
  bool mdhd_found;
  bool mdia_found;
  bool trak_found;
  char *ptr;
  init_fragment *this_local;
  
  ptr = (char *)this;
  _timescale = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&(this->moov_box_).box_data_);
  pos._3_1_ = 0;
  pos._2_1_ = 0;
  pos._1_1_ = 0;
  local_28 = 1;
  local_2c = 8;
  while( true ) {
    bVar5 = false;
    if ((pos._3_1_ & 1) == 0) {
      uVar3 = (ulong)local_2c;
      sVar4 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &(this->moov_box_).box_data_);
      bVar5 = uVar3 < sVar4;
    }
    if (!bVar5) break;
    puVar1 = _timescale + (ulong)local_2c + 4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"trak",&local_51);
    bVar5 = f_compare_4cc((char *)puVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (bVar5) {
      pos._3_1_ = 1;
    }
    else {
      uVar2 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32((char *)(_timescale + local_2c));
      local_2c = uVar2 + local_2c;
    }
  }
  if ((pos._3_1_ & 1) != 0) {
    local_2c = local_2c + 8;
    while( true ) {
      bVar5 = false;
      if ((pos._2_1_ & 1) == 0) {
        uVar3 = (ulong)local_2c;
        sVar4 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &(this->moov_box_).box_data_);
        bVar5 = uVar3 < sVar4;
      }
      if (!bVar5) break;
      puVar1 = _timescale + (ulong)local_2c + 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,"mdia",&local_89);
      bVar5 = f_compare_4cc((char *)puVar1,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      if (bVar5) {
        pos._2_1_ = 1;
      }
      else {
        uVar2 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32((char *)(_timescale + local_2c));
        local_2c = uVar2 + local_2c;
      }
    }
  }
  if ((pos._2_1_ & 1) != 0) {
    local_2c = local_2c + 8;
    while( true ) {
      bVar5 = false;
      if ((pos._1_1_ & 1) == 0) {
        uVar3 = (ulong)local_2c;
        sVar4 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &(this->moov_box_).box_data_);
        bVar5 = uVar3 < sVar4;
      }
      if (!bVar5) break;
      puVar1 = _timescale + (ulong)local_2c + 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_b0,"mdhd",&local_b1);
      bVar5 = f_compare_4cc((char *)puVar1,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      if (bVar5) {
        pos._1_1_ = 1;
      }
      else {
        uVar2 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32((char *)(_timescale + local_2c));
        local_2c = uVar2 + local_2c;
      }
    }
  }
  if ((pos._1_1_ & 1) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "warning no mdhd box found, required for event message track format");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = local_28;
  }
  else {
    if (_timescale[local_2c + 8] == '\x01') {
      local_28 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32
                           ((char *)(_timescale + (ulong)local_2c + 0x1c));
    }
    else {
      local_28 = anon_unknown.dwarf_11f6e1::fmp4_read_uint32
                           ((char *)(_timescale + (ulong)local_2c + 0x14));
    }
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t init_fragment::get_time_scale()
	{
		char *ptr = (char*)moov_box_.box_data_.data();

		bool trak_found = false;
		bool mdia_found = false;
		bool mdhd_found = false;
		uint32_t timescale = 1;

		uint32_t pos = 8;

		// find trak box 
		while (!trak_found && pos < moov_box_.box_data_.size())
		{
			if (f_compare_4cc(ptr + 4 + pos, "trak"))
				trak_found = true;
			else
				pos += fmp4_read_uint32(ptr + pos);
		}
		if (trak_found)
		{
			pos += 8;
			while(!mdia_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mdia"))
					mdia_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mdia_found)
		{
			pos += 8;
			while (!mdhd_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mdhd"))
					mdhd_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mdhd_found)
		{
			uint8_t version = (uint8_t)ptr[pos + 8];
			if (version == 1)
				timescale = fmp4_read_uint32(ptr + pos + 28);
			else
				timescale = fmp4_read_uint32(ptr + pos + 20);
			
			return timescale;
		}
		else
		    std::cout << "warning no mdhd box found, required for event message track format" << std::endl;
		    return timescale;
	
	}